

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superGate.c
# Opt level: O1

void Super_Precompute(Mio_Library_t *pLibGen,int nVarsMax,int nLevels,int nGatesMax,float tDelayMax,
                     float tAreaMax,int TimeLimit,int fSkipInv,int fVerbose,char *pFileName)

{
  int iVar1;
  FILE *__s;
  Vec_Str_t *__ptr;
  
  __s = fopen(pFileName,"wb");
  if (__s == (FILE *)0x0) {
    printf("Cannot open output file \"%s\".\n",pFileName);
    return;
  }
  __ptr = Super_PrecomputeStr(pLibGen,nVarsMax,nLevels,nGatesMax,tDelayMax,tAreaMax,TimeLimit,
                              fSkipInv,fVerbose);
  fwrite(__ptr->pArray,1,(long)__ptr->nSize,__s);
  fclose(__s);
  if (__ptr->pArray != (char *)0x0) {
    free(__ptr->pArray);
    __ptr->pArray = (char *)0x0;
  }
  if (__ptr != (Vec_Str_t *)0x0) {
    free(__ptr);
  }
  if (fVerbose != 0) {
    printf("The supergates are written using new format \"%s\" ",pFileName);
    iVar1 = Extra_FileSize(pFileName);
    printf("(%0.3f MB).\n",(double)iVar1 * 9.5367431640625e-07);
    return;
  }
  return;
}

Assistant:

void Super_Precompute( Mio_Library_t * pLibGen, int nVarsMax, int nLevels, int nGatesMax, float tDelayMax, float tAreaMax, int TimeLimit, int fSkipInv, int fVerbose, char * pFileName )
{
    Vec_Str_t * vStr;
    FILE * pFile = fopen( pFileName, "wb" );
    if ( pFile == NULL )
    {     
        printf( "Cannot open output file \"%s\".\n", pFileName );
        return;
    }
    vStr = Super_PrecomputeStr( pLibGen, nVarsMax, nLevels, nGatesMax, tDelayMax, tAreaMax, TimeLimit, fSkipInv, fVerbose );
    fwrite( Vec_StrArray(vStr), 1, Vec_StrSize(vStr), pFile );
    fclose( pFile );
    Vec_StrFree( vStr );
    // report the result of writing
    if ( fVerbose )
    {
        printf( "The supergates are written using new format \"%s\" ", pFileName );
        printf( "(%0.3f MB).\n", ((double)Extra_FileSize(pFileName))/(1<<20) );
    }
}